

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O2

char * ScanChars(FILE *out,size_t bufferSize,char *buffer)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = fgets(buffer,(int)bufferSize,(FILE *)out);
  if (pcVar1 == (char *)0x0) {
    PrintWithoutBuffering("no output -- ");
    pcVar1 = "FAILED";
  }
  else {
    pcVar2 = strchr(buffer,10);
    pcVar1 = "PASSED";
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
    }
  }
  return pcVar1;
}

Assistant:

const char* ScanChars(FILE* out, size_t bufferSize, char* buffer) {
    if (fgets(buffer, bufferSize, out) == NULL) {
        PrintWithoutBuffering("no output -- ");
        return Fail;
    }
    char* newlinePtr = strchr(buffer, '\n');
    if (newlinePtr != NULL) {
        *newlinePtr = '\0';
    }
    return Pass;
}